

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

nng_err nni_http_server_set_error_page(nni_http_server *s,nng_http_status code,char *html)

{
  nni_list *list;
  char *s_00;
  void *item;
  nng_err nVar1;
  
  s_00 = nni_strdup(html);
  nVar1 = NNG_ENOMEM;
  if (s_00 != (char *)0x0) {
    nni_mtx_lock(&s->errors_mtx);
    list = &s->errors;
    for (item = nni_list_first(list); item != (void *)0x0; item = nni_list_next(list,item)) {
      if (*(nng_http_status *)((long)item + 0x10) == code) goto LAB_0013acf1;
    }
    item = nni_zalloc(0x20);
    if (item == (void *)0x0) {
      nni_mtx_unlock(&s->mtx);
      nni_strfree(s_00);
    }
    else {
      *(nng_http_status *)((long)item + 0x10) = code;
      nni_list_append(list,item);
LAB_0013acf1:
      nni_strfree(*(char **)((long)item + 0x18));
      *(char **)((long)item + 0x18) = s_00;
      nni_mtx_unlock(&s->errors_mtx);
      nVar1 = NNG_OK;
    }
  }
  return nVar1;
}

Assistant:

nng_err
nni_http_server_set_error_page(
    nni_http_server *s, nng_http_status code, const char *html)
{
	char   *body;
	nng_err rv;

	// We copy the content, without the trailing NUL.
	if ((body = nni_strdup(html)) == NULL) {
		return (NNG_ENOMEM);
	}
	if ((rv = http_server_set_err(s, code, body)) != 0) {
		nni_strfree(body);
	}
	return (rv);
}